

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.h
# Opt level: O0

QPoint __thiscall QMouseEvent::pos(QMouseEvent *this)

{
  long lVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QPointF *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSinglePointEvent::position((QSinglePointEvent *)0x817a95);
  QVar2 = QPointF::toPoint(in_stack_ffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline QPoint pos() const { return position().toPoint(); }